

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageChannelValues * __thiscall
pbrt::Image::GetChannels
          (ImageChannelValues *__return_storage_ptr__,Image *this,Point2i p,ImageChannelDesc *desc,
          WrapMode2D wrapMode)

{
  ushort uVar1;
  PixelFormat PVar2;
  size_t sVar3;
  float *pfVar4;
  Half *pHVar5;
  ulong uVar6;
  bool bVar7;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar8;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar9;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar10;
  size_t sVar11;
  long lVar12;
  uint uVar13;
  float fVar14;
  long lVar15;
  ulong uVar16;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar17;
  span<const_unsigned_char> vin;
  span<const_unsigned_char> vin_00;
  span<float> vout;
  span<float> vout_00;
  Tuple2<pbrt::Point2,_int> local_50;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *local_48;
  float local_3c;
  polymorphic_allocator<float> local_38;
  
  sVar3 = (desc->offset).nStored;
  local_3c = 0.0;
  local_50 = p.super_Tuple2<pbrt::Point2,_int>;
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
            (&__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,sVar3,
             &local_3c,&local_38);
  bVar7 = RemapPixelCoords((Point2i *)&local_50,
                           (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,wrapMode);
  if (bVar7) {
    PVar2 = this->format;
    lVar12 = (long)((local_50.y * (this->resolution).super_Tuple2<pbrt::Point2,_int>.x + local_50.x)
                   * (int)(this->channelNames).nStored);
    if (PVar2 == U256) {
      if ((desc->offset).nStored != 0) {
        local_48 = &(desc->offset).field_2;
        lVar15 = 0;
        uVar16 = 0;
        do {
          paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                    *)(desc->offset).ptr;
          paVar10 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)(__return_storage_ptr__->
                       super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
          if (paVar8 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                         *)0x0) {
            paVar8 = local_48;
          }
          vin.ptr = (this->p8).ptr + *(int *)((long)paVar8 + lVar15) + lVar12;
          uVar6 = (this->encoding).
                  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                  .bits;
          if (paVar10 ==
              (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
               *)0x0) {
            paVar10 = &(__return_storage_ptr__->
                       super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).
                       field_2;
          }
          vout.ptr = (float *)((long)paVar10 + lVar15);
          if (uVar6 < 0x2000000000000) {
            *vout.ptr = (float)*vin.ptr / 255.0;
          }
          else if ((uVar6 & 0xffff000000000000) == 0x2000000000000) {
            vin.n = 1;
            vout.n = 1;
            sRGBColorEncoding::ToLinear((sRGBColorEncoding *)(uVar6 & 0xffffffffffff),vin,vout);
          }
          else {
            vin_00.n = 1;
            vin_00.ptr = vin.ptr;
            vout_00.n = 1;
            vout_00.ptr = vout.ptr;
            GammaColorEncoding::ToLinear
                      ((GammaColorEncoding *)(uVar6 & 0xffffffffffff),vin_00,vout_00);
          }
          uVar16 = uVar16 + 1;
          lVar15 = lVar15 + 4;
        } while (uVar16 < (desc->offset).nStored);
      }
    }
    else if (PVar2 == Half) {
      sVar3 = (desc->offset).nStored;
      if (sVar3 != 0) {
        paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                  *)(desc->offset).ptr;
        paVar17 = &(desc->offset).field_2;
        if (paVar8 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                       *)0x0) {
          paVar17 = paVar8;
        }
        pHVar5 = (this->p16).ptr;
        paVar10 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                   *)(__return_storage_ptr__->
                     super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
        paVar9 = &(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
        if (paVar10 !=
            (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)0x0) {
          paVar9 = paVar10;
        }
        sVar11 = 0;
        do {
          uVar1 = pHVar5[lVar12 + paVar17->fixed[sVar11]].h;
          uVar13 = (uint)uVar1 << 0xd;
          if ((uVar13 & 0xf800000) == 0xf800000) {
            fVar14 = (float)(uVar13 | 0x70000000);
          }
          else if ((uVar13 & 0xf800000) == 0) {
            fVar14 = (float)(uVar13 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar14 = (float)((uVar13 & 0xfffe000) + 0x38000000);
          }
          paVar9->fixed[sVar11] = (float)((int)(short)uVar1 & 0x80000000U | (uint)fVar14);
          sVar11 = sVar11 + 1;
        } while (sVar3 != sVar11);
      }
    }
    else {
      if (PVar2 != Float) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                 ,0x115,"Unhandled PixelFormat");
      }
      sVar3 = (desc->offset).nStored;
      if (sVar3 != 0) {
        paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                  *)(desc->offset).ptr;
        paVar17 = &(desc->offset).field_2;
        if (paVar8 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                       *)0x0) {
          paVar17 = paVar8;
        }
        pfVar4 = (this->p32).ptr;
        paVar10 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                   *)(__return_storage_ptr__->
                     super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
        paVar9 = &(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
        if (paVar10 !=
            (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
             *)0x0) {
          paVar9 = paVar10;
        }
        sVar11 = 0;
        do {
          paVar9->fixed[sVar11] = pfVar4[lVar12 + paVar17->fixed[sVar11]];
          sVar11 = sVar11 + 1;
        } while (sVar3 != sVar11);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::GetChannels(Point2i p, const ImageChannelDesc &desc,
                                      WrapMode2D wrapMode) const {
    ImageChannelValues cv(desc.offset.size(), Float(0));
    if (!RemapPixelCoords(&p, resolution, wrapMode))
        return cv;

    size_t pixelOffset = PixelOffset(p);
    switch (format) {
    case PixelFormat::U256: {
        for (int i = 0; i < desc.offset.size(); ++i)
            encoding.ToLinear({&p8[pixelOffset + desc.offset[i]], 1}, {&cv[i], 1});
        break;
    }
    case PixelFormat::Half: {
        for (int i = 0; i < desc.offset.size(); ++i)
            cv[i] = Float(p16[pixelOffset + desc.offset[i]]);
        break;
    }
    case PixelFormat::Float: {
        for (int i = 0; i < desc.offset.size(); ++i)
            cv[i] = p32[pixelOffset + desc.offset[i]];
        break;
    }
    default:
        LOG_FATAL("Unhandled PixelFormat");
    }

    return cv;
}